

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::minus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  long lVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  pointer pvVar16;
  pointer pvVar17;
  ulong uVar18;
  ulong uVar19;
  size_t i;
  long lVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_a8;
  pair<double,_double> local_88;
  Persistence_representations *local_78;
  long local_70;
  ulong local_68;
  Persistence_landscape *local_60;
  ulong local_58;
  ulong local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->number_of_functions_for_vectorization = 0;
  __return_storage_ptr__->number_of_functions_for_projections_to_reals = 0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = (*(long *)(this + 8) - *(long *)this) / 0x18;
  uVar10 = ((long)(land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar9 <= uVar10) {
    uVar9 = uVar10;
  }
  local_78 = this;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&land,uVar9,(allocator_type *)&local_a8);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,&land);
  uVar9 = 0;
  local_60 = land1;
LAB_00105c46:
  lVar14 = *(long *)local_78;
  lVar20 = *(long *)(local_78 + 8);
  uVar18 = lVar20 - lVar14;
  uVar11 = (long)uVar18 / 0x18;
  pvVar16 = (land1->land).
            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = (land1->land).
            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar19 = (long)pvVar17 - (long)pvVar16;
  uVar12 = (long)uVar19 / 0x18;
  uVar10 = uVar11;
  if (uVar12 < uVar11) {
    uVar10 = uVar12;
  }
  if (uVar9 == uVar10) {
    if (uVar12 < uVar11) {
      while( true ) {
        uVar18 = lVar20 - lVar14;
        uVar19 = (long)pvVar17 - (long)pvVar16;
        uVar9 = (long)uVar19 / 0x18;
        if ((ulong)((long)uVar19 / 0x18) < (ulong)((long)uVar18 / 0x18)) {
          uVar9 = (long)uVar18 / 0x18;
        }
        if (uVar12 == uVar9) break;
        lVar20 = uVar12 * 0x18;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
                  ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )&local_a8,
                   (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )(lVar14 + lVar20));
        lVar14 = *(long *)(*(long *)local_78 + lVar20);
        lVar20 = *(long *)(*(long *)local_78 + 8 + lVar20) - lVar14 >> 4;
        lVar15 = 0;
        while (bVar22 = lVar20 != 0, lVar20 = lVar20 + -1, bVar22) {
          puVar1 = (undefined8 *)(lVar14 + lVar15);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)
                   ((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->first + lVar15);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar15 = lVar15 + 0x10;
        }
        pvVar16 = (__return_storage_ptr__->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = *(pointer *)
                  ((long)&pvVar16[uVar12].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 0x10);
        ppVar6 = *(pointer *)
                  &pvVar16[uVar12].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl;
        ppVar7 = *(pointer *)
                  ((long)&pvVar16[uVar12].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 8);
        *(pointer *)
         &pvVar16[uVar12].
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl = local_a8._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&pvVar16[uVar12].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 8) = local_a8._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&pvVar16[uVar12].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 0x10) = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8._M_impl.super__Vector_impl_data._M_start = ppVar6;
        local_a8._M_impl.super__Vector_impl_data._M_finish = ppVar7;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
        std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        ~_Vector_base(&local_a8);
        uVar12 = uVar12 + 1;
        lVar14 = *(long *)local_78;
        lVar20 = *(long *)(local_78 + 8);
        pvVar16 = (land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar17 = (land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (uVar18 < uVar19) {
      uVar18 = (long)uVar18 / 0x18;
      while( true ) {
        uVar10 = (lVar20 - lVar14) / 0x18;
        uVar9 = ((long)pvVar17 - (long)pvVar16) / 0x18;
        if (uVar9 < uVar10) {
          uVar9 = uVar10;
        }
        if (uVar18 == uVar9) break;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
                  ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )&local_a8,pvVar16 + uVar18);
        pvVar16 = (local_60->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = *(long *)&pvVar16[uVar18].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl;
        lVar15 = (long)*(pointer *)
                        ((long)&pvVar16[uVar18].
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl + 8) - lVar14 >> 4;
        lVar20 = 8;
        while (bVar22 = lVar15 != 0, lVar15 = lVar15 + -1, bVar22) {
          dVar3 = *(double *)(lVar14 + lVar20);
          *(undefined8 *)((long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) =
               *(undefined8 *)(lVar14 + -8 + lVar20);
          *(double *)((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->first + lVar20) =
               0.0 - dVar3;
          lVar20 = lVar20 + 0x10;
        }
        pvVar16 = (__return_storage_ptr__->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = *(pointer *)
                  ((long)&pvVar16[uVar18].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 0x10);
        ppVar6 = *(pointer *)
                  &pvVar16[uVar18].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl;
        ppVar7 = *(pointer *)
                  ((long)&pvVar16[uVar18].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 8);
        *(pointer *)
         &pvVar16[uVar18].
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl = local_a8._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&pvVar16[uVar18].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 8) = local_a8._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&pvVar16[uVar18].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 0x10) = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8._M_impl.super__Vector_impl_data._M_start = ppVar6;
        local_a8._M_impl.super__Vector_impl_data._M_finish = ppVar7;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
        std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        ~_Vector_base(&local_a8);
        uVar18 = uVar18 + 1;
        lVar14 = *(long *)local_78;
        lVar20 = *(long *)(local_78 + 8);
        pvVar16 = (local_60->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar17 = (local_60->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::~vector(&land);
    return __return_storage_ptr__;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = 1;
  local_70 = 8;
  uVar11 = 0;
  uVar10 = 0;
  local_58 = uVar9;
  do {
    local_50 = uVar10 + 1;
    do {
      lVar20 = uVar11 * 0x10;
      lVar14 = lVar20 + 8;
      uVar18 = uVar9;
      uVar12 = uVar11;
      while( true ) {
        uVar9 = local_58;
        land1 = local_60;
        uVar12 = uVar12 + 1;
        lVar21 = uVar18 * 0x18;
        lVar15 = *(long *)(*(long *)local_78 + lVar21);
        lVar13 = *(long *)(*(long *)local_78 + 8 + lVar21);
        if (((ulong)(lVar13 - lVar15 >> 4) <= uVar11 + 1) ||
           (pvVar16 = (local_60->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           lVar4 = *(long *)&pvVar16[uVar18].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl,
           (ulong)((long)*(pointer *)
                          ((long)&pvVar16[uVar18].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar4 >> 4) <= local_50)) goto LAB_00105e73;
        dVar3 = *(double *)(lVar15 + -8 + lVar14);
        lVar13 = lVar4 + uVar10 * 0x10;
        local_88.first = *(double *)(lVar4 + uVar10 * 0x10);
        if (local_88.first <= dVar3) break;
        dVar23 = (*(double *)(lVar13 + 8) - *(double *)(lVar13 + -8)) /
                 (local_88.first - *(double *)(lVar13 + -0x10));
        local_88.second =
             *(double *)(lVar15 + lVar14) -
             (dVar23 * dVar3 + (*(double *)(lVar13 + -8) - *(double *)(lVar13 + -0x10) * dVar23));
        local_88.first = dVar3;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_a8,&local_88);
        lVar14 = lVar14 + 0x10;
        lVar20 = lVar20 + 0x10;
        uVar11 = uVar11 + 1;
        uVar18 = local_58;
      }
      if (local_88.first < dVar3) {
        dVar23 = (*(double *)(lVar15 + -0x10 + lVar14) - *(double *)(lVar15 + lVar14)) /
                 (*(double *)(lVar15 + -0x18 + lVar14) - dVar3);
        local_88.second =
             (dVar23 * local_88.first + (*(double *)(lVar15 + lVar14) - dVar3 * dVar23)) -
             *(double *)(lVar13 + 8);
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_a8,&local_88);
        goto LAB_00105e53;
      }
    } while ((dVar3 != local_88.first) || (NAN(dVar3) || NAN(local_88.first)));
    local_88.second = *(double *)(lVar15 + lVar14) - *(double *)(lVar13 + 8);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_a8,&local_88);
    uVar11 = uVar11 + 1;
LAB_00105e53:
    local_70 = local_70 + 0x10;
    local_68 = local_68 + 1;
    uVar10 = local_50;
  } while( true );
LAB_00105e73:
  while ((uVar12 < (ulong)(lVar13 - lVar15 >> 4) &&
         (pvVar16 = (land1->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (ulong)((long)*(pointer *)
                        ((long)&pvVar16[uVar18].
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl + 8) -
                 *(long *)&pvVar16[uVar18].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl >> 4) <= local_50))) {
    local_88.first = *(double *)(lVar15 + lVar20);
    local_88.second = ((double *)(lVar15 + lVar20))[1];
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_a8,&local_88);
    lVar15 = *(long *)(*(long *)local_78 + lVar21);
    lVar13 = *(long *)(*(long *)local_78 + 8 + lVar21);
    lVar20 = lVar20 + 0x10;
    uVar12 = uVar12 + 1;
  }
  lVar14 = local_70;
  for (uVar9 = local_68;
      ((ulong)(lVar13 - lVar15 >> 4) <= uVar12 &&
      (pvVar16 = (land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      lVar20 = *(long *)&pvVar16[uVar18].
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl,
      uVar9 < (ulong)((long)*(pointer *)
                             ((long)&pvVar16[uVar18].
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl + 8) - lVar20 >> 4))); uVar9 = uVar9 + 1) {
    local_88.second = 0.0 - *(double *)(lVar20 + lVar14);
    local_88.first = *(double *)(lVar20 + -8 + lVar14);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_a8,&local_88);
    lVar15 = *(long *)(*(long *)local_78 + lVar21);
    lVar13 = *(long *)(*(long *)local_78 + 8 + lVar21);
    lVar14 = lVar14 + 0x10;
  }
  local_88.first = 2147483647.0;
  local_88.second = 0.0;
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<std::pair<double,double>>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&local_a8,
             &local_88);
  pvVar16 = (__return_storage_ptr__->land).
            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = *(pointer *)
            ((long)&pvVar16[uVar18].
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl + 0x10);
  ppVar6 = *(pointer *)
            &pvVar16[uVar18].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl;
  ppVar7 = *(pointer *)
            ((long)&pvVar16[uVar18].
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl + 8);
  *(pointer *)
   &pvVar16[uVar18].
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl = local_a8._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&pvVar16[uVar18].
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl + 8) = local_a8._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&pvVar16[uVar18].
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl + 0x10) = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._M_impl.super__Vector_impl_data._M_start = ppVar6;
  local_a8._M_impl.super__Vector_impl_data._M_finish = ppVar7;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_a8);
  uVar9 = local_58 + 1;
  goto LAB_00105c46;
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}